

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

int x509_object_cmp(X509_OBJECT *a,X509_OBJECT *b)

{
  int iVar1;
  int iVar2;
  
  iVar2 = a->type;
  iVar1 = iVar2 - b->type;
  if (iVar1 == 0) {
    if (iVar2 == 2) {
      iVar2 = X509_CRL_cmp((X509_CRL *)(a->data).x509,(X509_CRL *)(b->data).x509);
      return iVar2;
    }
    iVar1 = 0;
    if (iVar2 == 1) {
      iVar2 = X509_subject_name_cmp((X509 *)(a->data).x509,(X509 *)(b->data).x509);
      return iVar2;
    }
  }
  return iVar1;
}

Assistant:

static int x509_object_cmp(const X509_OBJECT *a, const X509_OBJECT *b) {
  int ret = a->type - b->type;
  if (ret) {
    return ret;
  }
  switch (a->type) {
    case X509_LU_X509:
      return X509_subject_name_cmp(a->data.x509, b->data.x509);
    case X509_LU_CRL:
      return X509_CRL_cmp(a->data.crl, b->data.crl);
    default:
      // abort();
      return 0;
  }
}